

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetKotlinExtensionsClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor)

{
  string_view name_without_package;
  string local_40;
  
  java::(anonymous_namespace)::ClassNameWithoutPackageKotlin_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)descriptor,descriptor);
  name_without_package._M_str = local_40._M_dataplus._M_p;
  name_without_package._M_len = local_40._M_string_length;
  GetClassFullName_abi_cxx11_
            (__return_storage_ptr__,this,name_without_package,descriptor->file_,true,true,true);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetKotlinExtensionsClassName(
    const Descriptor* descriptor) {
  return GetClassFullName(ClassNameWithoutPackageKotlin(descriptor),
                          descriptor->file(), /*immutable=*/true,
                          /*is_own_file=*/true,
                          /*kotlin=*/true);
}